

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_symbol.cpp
# Opt level: O0

compile_errcode __thiscall
SymbolTable::GetArraySpace(SymbolTable *this,string *name,int *array_space)

{
  int iVar1;
  undefined1 local_68 [8];
  SymbolTableTerm term;
  int ret;
  int *array_space_local;
  string *name_local;
  SymbolTable *this_local;
  
  term._52_4_ = 0;
  SymbolTableTerm::SymbolTableTerm((SymbolTableTerm *)local_68);
  term._52_4_ = GetTerm(this,name,(SymbolTableTerm *)local_68);
  this_local._4_4_ = term._52_4_;
  if (term._52_4_ == 0) {
    iVar1 = SymbolTableTerm::GetArrayInformation((SymbolTableTerm *)local_68);
    *array_space = iVar1;
    this_local._4_4_ = 0;
  }
  SymbolTableTerm::~SymbolTableTerm((SymbolTableTerm *)local_68);
  return this_local._4_4_;
}

Assistant:

compile_errcode SymbolTable::GetArraySpace(const string& name, int& array_space) const {
    int ret = COMPILE_OK;
    SymbolTableTerm term;
    if ((ret = this->GetTerm(name, term)) != COMPILE_OK) {
        return ret;
    } else {
        array_space = term.GetArrayInformation();
        return COMPILE_OK;
    }
}